

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::SyncToLiteralsAndBackupInst::Exec
          (SyncToLiteralsAndBackupInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  Type *addr;
  Type *this_00;
  ScannerInfo *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint uVar5;
  CharCount CVar6;
  undefined4 *puVar7;
  Recycler *this_01;
  uint *puVar8;
  long lVar9;
  uint uVar10;
  byte bVar11;
  int iVar12;
  undefined1 local_80 [8];
  TrackAllocData data;
  type_info *local_38;
  
  uVar5 = (this->super_BackupMixin).backup.lower;
  CVar6 = *matchStart;
  if (inputLength - CVar6 < uVar5) {
LAB_00f09b54:
    *matchStart = inputLength;
    bVar3 = true;
  }
  else {
    if (*nextSyncInputOffset <= *inputOffset) {
      if (*inputOffset - CVar6 < uVar5) {
        *inputOffset = CVar6 + uVar5;
      }
      addr = &matcher->literalNextSyncInputOffsets;
      data._32_8_ = input;
      if ((matcher->literalNextSyncInputOffsets).ptr == (uint *)0x0) {
        if (4 < (this->super_ScannersMixin).numLiterals) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                             ,0x9e1,"(numLiterals <= MaxNumSyncLiterals)",
                             "numLiterals <= MaxNumSyncLiterals");
          if (!bVar3) goto LAB_00f09e8a;
          *puVar7 = 0;
        }
        local_80 = (undefined1  [8])&unsigned_int::typeinfo;
        data.typeinfo = (type_info *)0x0;
        data.plusSize = 4;
        data.count = (size_t)anon_var_dwarf_a8b685b;
        data.filename._0_4_ = 0x9e3;
        this_01 = Memory::Recycler::TrackAllocInfo(matcher->recycler,(TrackAllocData *)local_80);
        BVar4 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar4 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                             "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar3) goto LAB_00f09e8a;
          *puVar7 = 0;
        }
        puVar8 = (uint *)Memory::Recycler::
                         AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>(this_01,0x10);
        if (puVar8 == (uint *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar3) {
LAB_00f09e8a:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar7 = 0;
        }
        Memory::Recycler::WBSetBit((char *)addr);
        addr->ptr = puVar8;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      }
      puVar8 = addr->ptr;
      if ((firstIteration) && (0 < (this->super_ScannersMixin).numLiterals)) {
        lVar9 = 0;
        do {
          puVar8[lVar9] = *inputOffset;
          lVar9 = lVar9 + 1;
        } while (lVar9 < (this->super_ScannersMixin).numLiterals);
      }
      if ((this->super_ScannersMixin).numLiterals < 1) {
        bVar11 = 1;
        iVar12 = 0;
      }
      else {
        lVar9 = 0;
        iVar12 = -1;
        local_38 = (type_info *)0x0;
        do {
          uVar5 = puVar8[lVar9];
          if (puVar8[lVar9] < *inputOffset) {
            uVar5 = *inputOffset;
          }
          local_80 = (undefined1  [8])CONCAT44(local_80._4_4_,uVar5);
          pSVar1 = (this->super_ScannersMixin).infos[lVar9].ptr;
          this_00 = &(pSVar1->super_ScannerMixin).scanner;
          uVar5 = (pSVar1->super_ScannerMixin).super_LiteralMixin.offset;
          CVar6 = (pSVar1->super_ScannerMixin).super_LiteralMixin.length;
          if (pSVar1->isEquivClass == true) {
            bVar3 = TextbookBoyerMoore<char16_t>::Match<4u,4u>
                              (this_00,(Char *)data._32_8_,inputLength,(CharCount *)local_80,
                               (((matcher->program).ptr)->rep).insts.litbuf.ptr + uVar5,CVar6,
                               matcher->stats);
          }
          else {
            bVar3 = TextbookBoyerMoore<char16_t>::Match<1u,1u>
                              (this_00,(Char *)data._32_8_,inputLength,(CharCount *)local_80,
                               (((matcher->program).ptr)->rep).insts.litbuf.ptr + uVar5,CVar6,
                               matcher->stats);
          }
          CVar6 = inputLength;
          if (bVar3 != false) {
            bVar3 = (uint)local_80._0_4_ < (uint)local_38;
            if (bVar3 || iVar12 < 0) {
              local_38 = (type_info *)local_80;
            }
            local_38 = (type_info *)((ulong)local_38 & 0xffffffff);
            CVar6 = local_80._0_4_;
            if (bVar3 || iVar12 < 0) {
              iVar12 = (int)lVar9;
            }
          }
          puVar8[lVar9] = CVar6;
          lVar9 = lVar9 + 1;
        } while (lVar9 < (this->super_ScannersMixin).numLiterals);
        bVar11 = (byte)((uint)iVar12 >> 0x1f);
        iVar12 = (int)local_38;
      }
      if (bVar11 != 0) goto LAB_00f09b54;
      *nextSyncInputOffset = iVar12 + 1;
      uVar5 = (this->super_BackupMixin).backup.upper;
      if (uVar5 != 0xffffffff) {
        uVar10 = iVar12 - *matchStart;
        if (uVar5 <= iVar12 - *matchStart) {
          uVar10 = uVar5;
        }
        *matchStart = iVar12 - uVar10;
      }
      *inputOffset = *matchStart;
    }
    *instPointer = *instPointer + 0x15;
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

inline bool SyncToLiteralsAndBackupInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (backup.lower > inputLength - matchStart)
        {
            // Even match at very end doesn't allow for minimum backup
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        if (inputOffset < nextSyncInputOffset)
        {
            // We have not yet reached the offset in the input we last synced to before backing up, so it's unnecessary to sync
            // again since we'll sync to the same point in the input and back up to the same place we are at now
            instPointer += sizeof(*this);
            return false;
        }

        if (backup.lower > inputOffset - matchStart)
        {
            // No use looking for match until minimum backup is possible
            inputOffset = matchStart + backup.lower;
        }

        int besti = -1;
        CharCount bestMatchOffset = 0;

        if (matcher.literalNextSyncInputOffsets == nullptr)
        {
            Assert(numLiterals <= MaxNumSyncLiterals);
            matcher.literalNextSyncInputOffsets =
                RecyclerNewArrayLeaf(matcher.recycler, CharCount, ScannersMixin::MaxNumSyncLiterals);
        }
        CharCount* literalNextSyncInputOffsets = matcher.literalNextSyncInputOffsets;

        if (firstIteration)
        {
            for (int i = 0; i < numLiterals; i++)
            {
                literalNextSyncInputOffsets[i] = inputOffset;
            }
        }

        for (int i = 0; i < numLiterals; i++)
        {
            CharCount thisMatchOffset = literalNextSyncInputOffsets[i];
            if (inputOffset > thisMatchOffset)
            {
                thisMatchOffset = inputOffset;
            }

            if (infos[i]->isEquivClass
                ? (infos[i]->scanner.Match<CaseInsensitive::EquivClassSize>(
                    input
                    , inputLength
                    , thisMatchOffset
                    , matcher.program->rep.insts.litbuf + infos[i]->offset
                    , infos[i]->length
#if ENABLE_REGEX_CONFIG_OPTIONS
                    , matcher.stats
#endif
                    ))
                : (infos[i]->scanner.Match<1>(
                    input
                    , inputLength
                    , thisMatchOffset
                    , matcher.program->rep.insts.litbuf + infos[i]->offset
                    , infos[i]->length
#if ENABLE_REGEX_CONFIG_OPTIONS
                    , matcher.stats
#endif
                    )))
            {
                if (besti < 0 || thisMatchOffset < bestMatchOffset)
                {
                    besti = i;
                    bestMatchOffset = thisMatchOffset;
                }

                literalNextSyncInputOffsets[i] = thisMatchOffset;
            }
            else
            {
                literalNextSyncInputOffsets[i] = inputLength;
            }
        }

        if (besti < 0)
        {
            // No literals matched
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        nextSyncInputOffset = bestMatchOffset + 1;

        if (backup.upper != CharCountFlag)
        {
            // Set new start at most backup.upper from start of literal
            CharCount maxBackup = bestMatchOffset - matchStart;
            matchStart = bestMatchOffset - min(maxBackup, (CharCount)backup.upper);
        }
        // else: leave start where it is

        // Move input to new match start
        inputOffset = matchStart;
        instPointer += sizeof(*this);
        return false;
    }